

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mcu8str_view_str(mcu8str *__return_storage_ptr__,mcu8str *str)

{
  mcu8str *str_local;
  
  __return_storage_ptr__->c_str = str->c_str;
  __return_storage_ptr__->size = str->size;
  __return_storage_ptr__->buflen = __return_storage_ptr__->size + 1;
  __return_storage_ptr__->owns_memory = 0;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcu8str_view_str( const mcu8str * str )
  {
    mcu8str s;
    s.c_str = (char*)str->c_str;//cast away constness, but we will add it again in
                           //the return type (in c++).
    s.size = str->size;
    s.buflen = s.size + 1;//limit as much as possible.
    s.owns_memory = 0;
    return s;
  }